

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTSoundBank_Play(FACTSoundBank *pSoundBank,uint16_t nCueIndex,uint32_t dwFlags,
                           int32_t timeOffset,FACTCue **ppCue)

{
  undefined4 in_ECX;
  uint16_t nCueIndex_00;
  undefined4 in_EDX;
  undefined2 in_SI;
  long in_RDI;
  undefined8 *in_R8;
  FACTCue *result;
  FACTCue **in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint32_t uVar1;
  
  nCueIndex_00 = (uint16_t)((uint)in_ECX >> 0x10);
  if (in_RDI == 0) {
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = 0;
    }
    uVar1 = 1;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x1146f8);
    FACTSoundBank_Prepare
              ((FACTSoundBank *)CONCAT26(in_SI,CONCAT24(in_stack_ffffffffffffffec,in_EDX)),
               nCueIndex_00,in_stack_ffffffffffffffe0,(int32_t)((ulong)in_R8 >> 0x20),
               in_stack_ffffffffffffffd0);
    if (in_R8 == (undefined8 *)0x0) {
      *(undefined1 *)(in_stack_ffffffffffffffd0 + 2) = 1;
    }
    else {
      *in_R8 = in_stack_ffffffffffffffd0;
    }
    FACTCue_Play((FACTCue *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    FAudio_PlatformUnlockMutex((FAudioMutex)0x114755);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

uint32_t FACTSoundBank_Play(
	FACTSoundBank *pSoundBank,
	uint16_t nCueIndex,
	uint32_t dwFlags,
	int32_t timeOffset,
	FACTCue** ppCue /* Optional! */
) {
	FACTCue *result;
	if (pSoundBank == NULL)
	{
		if (ppCue != NULL)
		{
			*ppCue = NULL;
		}
		return 1;
	}

	FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);

	FACTSoundBank_Prepare(
		pSoundBank,
		nCueIndex,
		dwFlags,
		timeOffset,
		&result
	);
	if (ppCue != NULL)
	{
		*ppCue = result;
	}
	else
	{
		/* AKA we get to Destroy() this ourselves */
		result->managed = 1;
	}
	FACTCue_Play(result);

	FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
	return 0;
}